

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_send(quicly_conn_t *conn,quicly_address_t *dest,quicly_address_t *src,iovec *datagrams,
               size_t *num_datagrams,void *buf,size_t bufsize)

{
  uint32_t uVar1;
  int64_t iVar2;
  quicly_sent_packet_t *pqVar3;
  int64_t iVar4;
  quicly_send_context_t *in_RCX;
  quicly_conn_t *in_RDX;
  quicly_send_context_t *in_RSI;
  quicly_conn_t *in_RDI;
  long *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t epoch;
  quicly_sentmap_iter_t iter;
  int ret;
  quicly_send_context_t s;
  quicly_sentmap_iter_t *in_stack_ffffffffffffff28;
  quicly_conn_t *in_stack_ffffffffffffff30;
  quicly_conn_t *conn_00;
  quicly_conn_t *in_stack_ffffffffffffff38;
  ulong uVar5;
  quicly_conn_t *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar6;
  size_t epoch_00;
  undefined1 uVar7;
  undefined7 in_stack_ffffffffffffff69;
  undefined1 auStack_90 [32];
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  
  epoch_00 = 0;
  uVar7 = 0xff;
  local_30 = in_R9;
  memset(auStack_90,0,0x18);
  local_70 = *in_R8;
  local_68 = 0;
  local_60 = local_30;
  local_58 = local_30 + in_stack_00000008;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_38 = 0;
  lock_now(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  conn_00 = (quicly_conn_t *)(in_RDI->stash).now;
  iVar2 = quicly_get_first_timeout(in_stack_ffffffffffffff38);
  if ((long)conn_00 < iVar2) {
    iVar6 = 0;
  }
  else if ((in_RDI->super).state < QUICLY_STATE_CLOSING) {
    iVar6 = do_send(in_RDI,in_RSI);
    if (iVar6 == 0) {
      assert_consistency(conn_00,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    }
  }
  else {
    init_acks_iter(conn_00,in_stack_ffffffffffffff28);
    if ((((in_RDI->super).state == QUICLY_STATE_DRAINING) ||
        ((in_RDI->super).stats.num_frames_sent.transport_close +
         (in_RDI->super).stats.num_frames_sent.application_close != 0)) &&
       (pqVar3 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1383f7),
       pqVar3->packet_number == 0xffffffffffffffff)) {
      uVar1 = quicly_num_streams(in_RDI);
      if (uVar1 != 0) {
        __assert_fail("quicly_num_streams(conn) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x1156,
                      "int quicly_send(quicly_conn_t *, quicly_address_t *, quicly_address_t *, struct iovec *, size_t *, void *, size_t)"
                     );
      }
      iVar6 = 0xff03;
    }
    else {
      if (((in_RDI->super).state == QUICLY_STATE_CLOSING) &&
         ((in_RDI->egress).send_ack_at <= (in_RDI->stash).now)) {
        destroy_all_streams(in_stack_ffffffffffffff40,
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                            (int)in_stack_ffffffffffffff38);
        for (uVar5 = 0; uVar5 < 4; uVar5 = uVar5 + 1) {
          iVar6 = send_connection_close
                            ((quicly_conn_t *)CONCAT71(in_stack_ffffffffffffff69,uVar7),epoch_00,
                             (quicly_send_context_t *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          if (iVar6 != 0) goto LAB_00138599;
          in_stack_ffffffffffffff5c = 0;
        }
        iVar6 = commit_send_packet(in_RDX,in_RCX,
                                   (en_quicly_send_packet_mode_t)((ulong)in_R8 >> 0x20));
        if (iVar6 != 0) goto LAB_00138599;
      }
      pqVar3 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1384ff);
      iVar2 = pqVar3->sent_at;
      iVar4 = get_sentmap_expiration_time((quicly_conn_t *)0x138514);
      (in_RDI->egress).send_ack_at = iVar2 + iVar4;
      if (iVar2 + iVar4 <= (in_RDI->stash).now) {
        (in_RDI->egress).send_ack_at = (in_RDI->stash).now + 1;
      }
      iVar6 = 0;
    }
  }
LAB_00138599:
  clear_datagram_frame_payloads(in_stack_ffffffffffffff40);
  if (local_68 != 0) {
    (in_RSI->current).cipher = *(st_quicly_cipher_context_t **)&(in_RDI->super).remote.address;
    *(undefined8 *)&(in_RSI->current).first_byte =
         *(undefined8 *)((long)&(in_RDI->super).remote.address + 8);
    (in_RSI->target).cipher =
         *(st_quicly_cipher_context_t **)((long)&(in_RDI->super).remote.address + 0x10);
    *(uint32_t *)&(in_RSI->target).first_byte_at = (in_RDI->super).remote.address.sin6.sin6_scope_id
    ;
    (in_RDX->super).ctx = *(quicly_context_t **)&(in_RDI->super).local.address;
    *(undefined8 *)&(in_RDX->super).state =
         *(undefined8 *)((long)&(in_RDI->super).local.address + 8);
    *(undefined8 *)&(in_RDX->super).local.cid_set.plaintext =
         *(undefined8 *)((long)&(in_RDI->super).local.address + 0x10);
    *(uint32_t *)&(in_RDX->super).local.cid_set.plaintext.node_id =
         (in_RDI->super).local.address.sin6.sin6_scope_id;
  }
  *in_R8 = local_68;
  unlock_now((quicly_conn_t *)0x13863d);
  return iVar6;
}

Assistant:

int quicly_send(quicly_conn_t *conn, quicly_address_t *dest, quicly_address_t *src, struct iovec *datagrams, size_t *num_datagrams,
                void *buf, size_t bufsize)
{
    quicly_send_context_t s = {{NULL, -1}, {}, datagrams, *num_datagrams, 0, {buf, (uint8_t *)buf + bufsize}};
    int ret;

    lock_now(conn, 0);

    /* bail out if there's nothing is scheduled to be sent */
    if (conn->stash.now < quicly_get_first_timeout(conn)) {
        ret = 0;
        goto Exit;
    }

    QUICLY_PROBE(SEND, conn, conn->stash.now, conn->super.state,
                 QUICLY_PROBE_HEXDUMP(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len));

    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        quicly_sentmap_iter_t iter;
        init_acks_iter(conn, &iter);
        /* check if the connection can be closed now (after 3 pto) */
        if (conn->super.state == QUICLY_STATE_DRAINING ||
            conn->super.stats.num_frames_sent.transport_close + conn->super.stats.num_frames_sent.application_close != 0) {
            if (quicly_sentmap_get(&iter)->packet_number == UINT64_MAX) {
                assert(quicly_num_streams(conn) == 0);
                ret = QUICLY_ERROR_FREE_CONNECTION;
                goto Exit;
            }
        }
        if (conn->super.state == QUICLY_STATE_CLOSING && conn->egress.send_ack_at <= conn->stash.now) {
            /* destroy all streams; doing so is delayed until the emission of CONNECTION_CLOSE frame to allow quicly_close to be
             * called from a stream handler */
            destroy_all_streams(conn, 0, 0);
            /* send CONNECTION_CLOSE in all possible epochs */
            for (size_t epoch = 0; epoch < QUICLY_NUM_EPOCHS; ++epoch) {
                if ((ret = send_connection_close(conn, epoch, &s)) != 0)
                    goto Exit;
            }
            if ((ret = commit_send_packet(conn, &s, QUICLY_COMMIT_SEND_PACKET_MODE_SMALL)) != 0)
                goto Exit;
        }
        /* wait at least 1ms */
        if ((conn->egress.send_ack_at = quicly_sentmap_get(&iter)->sent_at + get_sentmap_expiration_time(conn)) <= conn->stash.now)
            conn->egress.send_ack_at = conn->stash.now + 1;
        ret = 0;
        goto Exit;
    }

    /* emit packets */
    if ((ret = do_send(conn, &s)) != 0)
        goto Exit;

    assert_consistency(conn, 1);

Exit:
    clear_datagram_frame_payloads(conn);
    if (s.num_datagrams != 0) {
        *dest = conn->super.remote.address;
        *src = conn->super.local.address;
    }
    *num_datagrams = s.num_datagrams;
    unlock_now(conn);
    return ret;
}